

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  TCPServer server;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  TCPServer local_1a8;
  
  printf("%s: echo server port:%d\n","echo_server.cpp",6000);
  SocketPP::TCPServer::TCPServer(&local_1a8,6000);
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<void_(const_SocketPP::TCPStream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp:11:26)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(const_SocketPP::TCPStream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp:11:26)>
              ::_M_manager;
  SocketPP::TCPServer::setConnHandle(&local_1a8,(StreamHandle *)&local_1c8);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<void_(const_SocketPP::TCPStream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp:15:26)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(const_SocketPP::TCPStream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp:15:26)>
              ::_M_manager;
  SocketPP::TCPServer::setDiscHandle(&local_1a8,(StreamHandle *)&local_1c8);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<void_(const_SocketPP::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp:19:26)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(const_SocketPP::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/examples/echo_server.cpp:19:26)>
              ::_M_manager;
  local_1c8._M_unused._M_object = &local_1a8;
  SocketPP::TCPServer::setRecvHandle(&local_1a8,(MessageHandle *)&local_1c8);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  iVar1 = SocketPP::SocketServer::loop(&local_1a8.super_SocketServer);
  SocketPP::TCPServer::~TCPServer(&local_1a8);
  return iVar1;
}

Assistant:

int main() {
    const int port = 6000;
    LOGI("echo server port:%d", port);

    TCPServer server(port);

    server.setConnHandle([] (const TCPStream& stream) {
        LOGI("on connected: fd=%d", stream.fd);
    });

    server.setDiscHandle([] (const TCPStream& stream) {
        LOGI("on disconnected: fd=%d", stream.fd);
    });

    server.setRecvHandle([&] (const Message& message) {
        LOGI("on receive: fd=%d, msg:%s", message.target.fd, message.rawMsg.toString().c_str());
        server.send(message);
    });

    return server.loop();
}